

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitput.c
# Opt level: O0

RK_S32 mpp_set_bitput_ctx(BitputCtx_t *bp,RK_U64 *data,RK_U32 len)

{
  RK_U32 len_local;
  RK_U64 *data_local;
  BitputCtx_t *bp_local;
  
  memset(bp,0,0x20);
  bp->index = 0;
  bp->bitpos = '\0';
  bp->bvalue = 0;
  bp->size = len;
  bp->buflen = len;
  bp->pbuf = data;
  return 0;
}

Assistant:

RK_S32 mpp_set_bitput_ctx(BitputCtx_t *bp, RK_U64 *data, RK_U32 len)
{
    memset(bp, 0, sizeof(BitputCtx_t));
    bp->index  = 0;
    bp->bitpos = 0;
    bp->bvalue = 0;
    bp->size   = len;
    bp->buflen = len;  // align 64bit
    bp->pbuf   = data;
    return 0;
}